

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O0

void bcread_knum(LexState *ls,GCproto *pt,MSize sizekn)

{
  byte bVar1;
  uint32_t uVar2;
  uint in_EDX;
  long in_RSI;
  LexState *in_RDI;
  uint32_t lo;
  int isnum;
  TValue *o;
  MSize i;
  double *local_30;
  uint local_28;
  
  local_30 = (double *)(ulong)*(uint *)(in_RSI + 0x10);
  for (local_28 = 0; local_28 < in_EDX; local_28 = local_28 + 1) {
    bVar1 = *in_RDI->p;
    uVar2 = bcread_uleb128_33(in_RDI);
    if ((bVar1 & 1) == 0) {
      *local_30 = (double)(int)uVar2;
    }
    else {
      *(uint32_t *)local_30 = uVar2;
      uVar2 = bcread_uleb128(in_RDI);
      *(uint32_t *)((long)local_30 + 4) = uVar2;
    }
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

static void bcread_knum(LexState *ls, GCproto *pt, MSize sizekn)
{
  MSize i;
  TValue *o = mref(pt->k, TValue);
  for (i = 0; i < sizekn; i++, o++) {
    int isnum = (ls->p[0] & 1);
    uint32_t lo = bcread_uleb128_33(ls);
    if (isnum) {
      o->u32.lo = lo;
      o->u32.hi = bcread_uleb128(ls);
    } else {
      setintV(o, lo);
    }
  }
}